

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m68kops.c
# Opt level: O3

void m68k_op_stop(void)

{
  byte bVar1;
  uint uVar2;
  uint addr_in;
  
  if (m68ki_cpu.s_flag != 0) {
    my_fc_handler(m68ki_cpu.s_flag | 2);
    addr_in = m68ki_cpu.pc & m68ki_cpu.address_mask;
    m68ki_cpu.pc = m68ki_cpu.pc + 2;
    my_fc_handler(m68ki_cpu.s_flag | 2);
    if (m68ki_cpu.pmmu_enabled != 0) {
      addr_in = pmmu_translate_addr(addr_in);
    }
    uVar2 = m68k_read_memory_16(addr_in & m68ki_cpu.address_mask);
    m68ki_cpu.stopped._0_1_ = (byte)m68ki_cpu.stopped | 1;
    m68ki_set_sr(uVar2);
    bVar1 = m68ki_cpu.cyc_instruction[m68ki_cpu.ir];
    uVar2 = (uint)bVar1;
    if (m68ki_remaining_cycles < (int)(uint)bVar1) {
      uVar2 = m68ki_remaining_cycles % (int)(uint)bVar1;
    }
    m68ki_remaining_cycles = uVar2;
    return;
  }
  m68ki_exception_privilege_violation();
  return;
}

Assistant:

static void m68k_op_stop(void)
{
	if(FLAG_S)
	{
		uint new_sr = OPER_I_16();
		m68ki_trace_t0();			   /* auto-disable (see m68kcpu.h) */
		CPU_STOPPED |= STOP_LEVEL_STOP;
		m68ki_set_sr(new_sr);
		if(m68ki_remaining_cycles >= CYC_INSTRUCTION[REG_IR])
			m68ki_remaining_cycles = CYC_INSTRUCTION[REG_IR];
		else
			USE_ALL_CYCLES();
		return;
	}
	m68ki_exception_privilege_violation();
}